

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O0

int main(void)

{
  int iVar1;
  time_t tVar2;
  size_t sVar3;
  
  plan(2);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  tVar2 = time((time_t *)0x0);
  seed = (uint)tVar2;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"random seed is %u",(ulong)seed);
  fprintf(_stdout,"\n");
  srand(seed);
  iVar1 = rand();
  objsize = iVar1 % 0x1000;
  if (objsize < 8) {
    objsize = 8;
  }
  sVar3 = small_align((long)objsize,8);
  objsize = (int)sVar3;
  quota_init(&quota,0xffffffff);
  slab_arena_create(&arena,&quota,0,4000000,2);
  slab_cache_create(&cache,&arena);
  mempool_basic();
  mempool_align();
  slab_cache_destroy(&cache);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(3);
#else
	plan(2);
#endif
	header();

	seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);

	objsize = rand() % OBJSIZE_MAX;
	if (objsize < OBJSIZE_MIN)
		objsize = OBJSIZE_MIN;
	/*
	 * Mempool does not work with not aligned sizes. Because
	 * it utilizes the unused blocks for storing internal
	 * info, which needs alignment.
	 */
	objsize = small_align(objsize, alignof(uint64_t));

	quota_init(&quota, UINT_MAX);

	slab_arena_create(&arena, &quota, 0,
			  4000000, MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	mempool_basic();
	mempool_align();
#ifdef ENABLE_ASAN
	mempool_membership();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}